

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.cc
# Opt level: O0

int x509_digest_sign_algorithm(EVP_MD_CTX *ctx,X509_ALGOR *algor)

{
  EVP_PKEY *pEVar1;
  int iVar2;
  int iVar3;
  ASN1_OBJECT *pAVar4;
  int local_40;
  int paramtype;
  int sign_nid;
  int digest_nid;
  EVP_MD *digest;
  EVP_PKEY *pEStack_28;
  int pad_mode;
  EVP_PKEY *pkey;
  X509_ALGOR *algor_local;
  EVP_MD_CTX *ctx_local;
  
  pkey = (EVP_PKEY *)algor;
  algor_local = (X509_ALGOR *)ctx;
  pEStack_28 = EVP_PKEY_CTX_get0_pkey((EVP_PKEY_CTX *)ctx->pctx);
  if (pEStack_28 == (EVP_PKEY *)0x0) {
    ERR_put_error(0xc,0,0x6c,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/algorithm.cc"
                  ,0x26);
    return 0;
  }
  iVar2 = EVP_PKEY_id(pEStack_28);
  if (iVar2 == 6) {
    iVar2 = EVP_PKEY_CTX_get_rsa_padding
                      ((EVP_PKEY_CTX *)algor_local[1].algorithm,(int *)((long)&digest + 4));
    if (iVar2 == 0) {
      return 0;
    }
    if (digest._4_4_ == 6) {
      iVar2 = x509_rsa_ctx_to_pss((EVP_MD_CTX *)algor_local,(X509_ALGOR *)pkey);
      return iVar2;
    }
  }
  iVar2 = EVP_PKEY_id(pEStack_28);
  pEVar1 = pkey;
  if (iVar2 == 0x3b5) {
    pAVar4 = OBJ_nid2obj(0x3b5);
    ctx_local._4_4_ = X509_ALGOR_set0((X509_ALGOR *)pEVar1,pAVar4,-1,(void *)0x0);
  }
  else {
    _sign_nid = (EVP_MD *)EVP_MD_CTX_get0_md((EVP_MD_CTX *)algor_local);
    if (_sign_nid == (EVP_MD *)0x0) {
      ERR_put_error(0xc,0,0x6c,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/algorithm.cc"
                    ,0x3d);
      ctx_local._4_4_ = 0;
    }
    else {
      paramtype = EVP_MD_type(_sign_nid);
      iVar3 = x509_digest_nid_ok(paramtype);
      iVar2 = paramtype;
      if (iVar3 != 0) {
        iVar3 = EVP_PKEY_id(pEStack_28);
        iVar2 = OBJ_find_sigid_by_algs(&local_40,iVar2,iVar3);
        if (iVar2 != 0) {
          iVar2 = EVP_PKEY_id(pEStack_28);
          pEVar1 = pkey;
          iVar3 = -1;
          if (iVar2 == 6) {
            iVar3 = 5;
          }
          pAVar4 = OBJ_nid2obj(local_40);
          iVar2 = X509_ALGOR_set0((X509_ALGOR *)pEVar1,pAVar4,iVar3,(void *)0x0);
          return iVar2;
        }
      }
      ERR_put_error(0xc,0,0x6f,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/algorithm.cc"
                    ,0x45);
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int x509_digest_sign_algorithm(EVP_MD_CTX *ctx, X509_ALGOR *algor) {
  EVP_PKEY *pkey = EVP_PKEY_CTX_get0_pkey(ctx->pctx);
  if (pkey == NULL) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_CONTEXT_NOT_INITIALISED);
    return 0;
  }

  if (EVP_PKEY_id(pkey) == EVP_PKEY_RSA) {
    int pad_mode;
    if (!EVP_PKEY_CTX_get_rsa_padding(ctx->pctx, &pad_mode)) {
      return 0;
    }
    // RSA-PSS has special signature algorithm logic.
    if (pad_mode == RSA_PKCS1_PSS_PADDING) {
      return x509_rsa_ctx_to_pss(ctx, algor);
    }
  }

  if (EVP_PKEY_id(pkey) == EVP_PKEY_ED25519) {
    return X509_ALGOR_set0(algor, OBJ_nid2obj(NID_ED25519), V_ASN1_UNDEF, NULL);
  }

  // Default behavior: look up the OID for the algorithm/hash pair and encode
  // that.
  const EVP_MD *digest = EVP_MD_CTX_get0_md(ctx);
  if (digest == NULL) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_CONTEXT_NOT_INITIALISED);
    return 0;
  }

  const int digest_nid = EVP_MD_type(digest);
  int sign_nid;
  if (!x509_digest_nid_ok(digest_nid) ||
      !OBJ_find_sigid_by_algs(&sign_nid, digest_nid, EVP_PKEY_id(pkey))) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_DIGEST_AND_KEY_TYPE_NOT_SUPPORTED);
    return 0;
  }

  // RSA signature algorithms include an explicit NULL parameter. Others omit
  // it.
  int paramtype =
      (EVP_PKEY_id(pkey) == EVP_PKEY_RSA) ? V_ASN1_NULL : V_ASN1_UNDEF;
  return X509_ALGOR_set0(algor, OBJ_nid2obj(sign_nid), paramtype, NULL);
}